

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestRuntimeFail.cpp
# Opt level: O1

void __thiscall Test_testMultipleTransitions::Run(Test_testMultipleTransitions *this)

{
  nullres nVar1;
  nullres nVar2;
  int iVar3;
  char *pcVar4;
  long lVar5;
  char *pcVar6;
  
  if (Tests::messageVerbose == '\x01') {
    puts("Call stack when there are various transitions between NULLC and C\r");
  }
  lVar5 = 0;
  do {
    if ((&Tests::testFailureExecutor)[lVar5] == '\x01') {
      testsCount[lVar5] = testsCount[lVar5] + 1;
      nullcSetExecutor(testTarget[lVar5]);
      nVar1 = nullcBuild(testCallStackWhenVariousTransitions);
      if (nVar1 == '\0') {
        if (Tests::messageVerbose == '\0') {
          puts("Call stack when there are various transitions between NULLC and C\r");
        }
        pcVar6 = nullcGetLastError();
        printf("Compilation failed: %s\r\n",pcVar6);
      }
      else {
        nVar2 = nullcRun();
        pcVar6 = error;
        if (nVar2 == '\0') {
          pcVar4 = nullcGetLastError();
          iVar3 = strcmp(pcVar6,pcVar4);
          if (iVar3 == 0) {
            testsPassed[lVar5] = testsPassed[lVar5] + 1;
          }
          else {
            if (Tests::messageVerbose == '\0') {
              puts("Call stack when there are various transitions between NULLC and C\r");
            }
            pcVar6 = "REGVM";
            if (testTarget[lVar5] == 2) {
              pcVar6 = "LLVM";
            }
            if (testTarget[lVar5] == 1) {
              pcVar6 = "X86";
            }
            pcVar4 = nullcGetLastError();
            printf("%s failed but for wrong reason:\r\n    %s\r\nexpected:\r\n    %s\r\n",pcVar6,
                   pcVar4,error);
          }
        }
        else {
          if (Tests::messageVerbose == '\0') {
            puts("Call stack when there are various transitions between NULLC and C\r");
          }
          puts("Test should have failed.\r");
        }
      }
      if (nVar1 == '\0') {
        return;
      }
    }
    if (1 < (uint)lVar5) {
      return;
    }
    lVar5 = lVar5 + 1;
  } while( true );
}

Assistant:

virtual void Run()
	{
		if(Tests::messageVerbose)
			printf("Call stack when there are various transitions between NULLC and C\r\n");
		for(int t = 0; t < TEST_TARGET_COUNT; t++)
		{
			if(!Tests::testFailureExecutor[t])
				continue;
			testsCount[t]++;
			nullcSetExecutor(testTarget[t]);
			nullres good = nullcBuild(testCallStackWhenVariousTransitions);
			if(!good)
			{
				if(!Tests::messageVerbose)
					printf("Call stack when there are various transitions between NULLC and C\r\n");
				printf("Compilation failed: %s\r\n", nullcGetLastError());
				break;
			}
			good = nullcRun();
			if(!good)
			{
				if(strcmp(error, nullcGetLastError()) != 0)
				{
					if(!Tests::messageVerbose)
						printf("Call stack when there are various transitions between NULLC and C\r\n");

					const char *targetName = testTarget[t] == NULLC_X86 ? "X86" : (testTarget[t] == NULLC_LLVM ? "LLVM" : "REGVM");

					printf("%s failed but for wrong reason:\r\n    %s\r\nexpected:\r\n    %s\r\n", targetName, nullcGetLastError(), error);
				}else{
					testsPassed[t]++;
				}
			}else{
				if(!Tests::messageVerbose)
					printf("Call stack when there are various transitions between NULLC and C\r\n");
				printf("Test should have failed.\r\n");
			}
		}
	}